

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# offset64_test.cpp
# Opt level: O3

void flatbuffers::tests::Offset64ForceAlign(void)

{
  Offset<RootTable> root;
  initializer_list<unsigned_char> __l;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  FlatBufferBuilder64 builder;
  allocator_type local_a4;
  uchar local_a3 [3];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a0;
  FlatBufferBuilder64 local_88;
  
  local_88.buf_.allocator_ = (Allocator *)0x0;
  local_88.buf_.own_allocator_ = false;
  local_88.buf_.initial_size_ = 0x400;
  local_88.buf_.max_size_ = 0x7fffffffffffffff;
  local_88.buf_.buffer_minalign_ = 8;
  local_88.length_of_64_bit_region_ = 0;
  local_88.nested = false;
  local_88.finished = false;
  local_88.buf_.reserved_ = 0;
  local_88.buf_.size_ = 0;
  local_88.buf_.buf_ = (uint8_t *)0x0;
  local_88.buf_.cur_._0_6_ = 0;
  local_88.buf_.cur_._6_2_ = 0;
  local_88.buf_.scratch_._0_6_ = 0;
  local_88._78_8_ = 0;
  local_88.minalign_ = 1;
  local_88.force_defaults_ = false;
  local_88.dedup_vtables_ = true;
  local_88.string_pool = (StringOffsetMap *)0x0;
  local_a3[0] = '\x01';
  local_a3[1] = '\x02';
  local_a3[2] = 3;
  __l._M_len = 3;
  __l._M_array = local_a3;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_a0,__l,&local_a4);
  root = CreateRootTableDirect
                   (&local_88,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0,0,
                    (char *)0x0,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0,
                    (char *)0x0,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0,
                    (vector<LeafStruct,_std::allocator<LeafStruct>_> *)0x0,
                    (vector<LeafStruct,_std::allocator<LeafStruct>_> *)0x0,
                    (vector<flatbuffers::Offset<WrapperTable>,_std::allocator<flatbuffers::Offset<WrapperTable>_>_>
                     *)0x0,&local_a0);
  FlatBufferBuilderImpl<true>::Finish(&local_88,root.o,(char *)0x0,false);
  if (local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  FlatBufferBuilderImpl<true>::~FlatBufferBuilderImpl(&local_88);
  return;
}

Assistant:

void Offset64ForceAlign() {
  FlatBufferBuilder64 builder;

  // Setup some data to serialize that is less than the force_align size of 32
  // bytes.
  std::vector<uint8_t> data{ 1, 2, 3 };

  // Use the CreateDirect which calls the ForceVectorAlign
  const auto root_table_offset =
      CreateRootTableDirect(builder, nullptr, 0, nullptr, nullptr, nullptr,
                            nullptr, nullptr, nullptr, nullptr, &data);

  // Finish the buffer.
  FinishRootTableBuffer(builder, root_table_offset);
}